

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O3

TCGArg do_constant_folding(TCGContext_conflict9 *s,TCGOpcode op,TCGArg x,TCGArg y)

{
  char *pcVar1;
  byte *pbVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  _Bool _Var6;
  TCGArg TVar7;
  ulong uVar8;
  byte bVar9;
  uint64_t uVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  TCGArg extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t uVar14;
  uint64_t y_00;
  ulong uVar15;
  TCGCond in_R8D;
  uint uVar16;
  uint64_t uVar17;
  
  uVar8 = (ulong)op;
  if (0x6f < op - INDEX_op_add_i32) {
switchD_00d4a5bf_caseD_18:
    uVar15 = (ulong)op;
    do_constant_folding_cold_1();
    pcVar1 = *(char **)(extraout_RDX + 0x30);
    pbVar2 = *(byte **)(y + 0x30);
    y_00 = *(uint64_t *)(pbVar2 + 0x18);
    if ((*pcVar1 != '\x01') || (*pbVar2 != 1)) {
      if (extraout_RDX != y) {
        TVar7 = *(TCGArg *)(pcVar1 + 0x10);
        if ((TVar7 != extraout_RDX) && (*(TCGArg *)(pbVar2 + 0x10) != y)) {
          do {
            if (TVar7 == y) goto LAB_00d4a8e5;
            TVar7 = *(TCGArg *)(*(long *)(TVar7 + 0x30) + 0x10);
          } while (TVar7 != extraout_RDX);
        }
        if ((y_00 == 0 & *pbVar2) != 1) {
          return 2;
        }
        if (in_R8D == TCG_COND_LTU) {
          return 0;
        }
        return (ulong)(in_R8D != TCG_COND_GEU) + 1;
      }
LAB_00d4a8e5:
      bVar5 = do_constant_folding_cond_eq(in_R8D);
      goto LAB_00d4a942;
    }
    uVar14 = *(uint64_t *)(pcVar1 + 0x18);
    uVar10 = *(uint64_t *)(uVar15 + 0x8168);
    if ((*(byte *)(uVar10 + 0xc + (uVar8 & 0xffffffff) * 0x20) & 0x10) != 0) {
      bVar5 = do_constant_folding_cond_64(uVar14,y_00,in_R8D);
      goto LAB_00d4a942;
    }
    in_R8D = in_R8D - TCG_COND_LT;
    if (in_R8D < TCG_COND_LEU) {
      uVar10 = (long)&switchD_00d4a8d7::switchdataD_00dca130 +
               (long)(int)(&switchD_00d4a8d7::switchdataD_00dca130)[in_R8D];
      uVar13 = (uint)y_00;
      uVar12 = (uint)uVar14;
      switch(in_R8D) {
      case TCG_COND_NEVER:
        bVar5 = (int)uVar12 < (int)uVar13;
        break;
      case TCG_COND_ALWAYS:
        bVar5 = (int)uVar13 <= (int)uVar12;
        break;
      case TCG_COND_LT:
        bVar5 = uVar12 < uVar13;
        break;
      case TCG_COND_GE:
        bVar5 = uVar13 <= uVar12;
        break;
      default:
        goto switchD_00d4a8d7_caseD_4;
      case TCG_COND_LTU|TCG_COND_LT:
        bVar5 = uVar12 == uVar13;
        break;
      case TCG_COND_LTU|TCG_COND_GE:
        bVar5 = uVar12 != uVar13;
        break;
      case TCG_COND_EQ:
        bVar5 = (int)uVar12 <= (int)uVar13;
        break;
      case TCG_COND_NE:
        bVar5 = (int)uVar13 < (int)uVar12;
        break;
      case TCG_COND_LE:
        bVar5 = uVar12 <= uVar13;
        break;
      case TCG_COND_GT:
        bVar5 = uVar13 < uVar12;
      }
LAB_00d4a942:
      return (ulong)bVar5;
    }
switchD_00d4a8d7_caseD_4:
    do_constant_folding_cond_cold_1();
    pcVar1 = *(char **)(extraout_RDX_00 + 0x30);
    if ((*pcVar1 == '\x01') && (**(char **)(uVar10 + 0x30) == '\x01')) {
      uVar8 = *(long *)(*(char **)(uVar10 + 0x30) + 0x18) << 0x20 | (ulong)*(uint *)(pcVar1 + 0x18);
      if ((**(char **)(uVar14 + 0x30) == '\x01') && (**(char **)(y_00 + 0x30) == '\x01')) {
        _Var6 = do_constant_folding_cond_64
                          (*(long *)(*(char **)(y_00 + 0x30) + 0x18) << 0x20 |
                           (ulong)*(uint *)(*(char **)(uVar14 + 0x30) + 0x18),uVar8,in_R8D);
        goto LAB_00d4a9f5;
      }
      if (uVar8 == 0) {
        if (in_R8D == TCG_COND_LTU) {
          return 0;
        }
        if (in_R8D == TCG_COND_GEU) {
          return 1;
        }
      }
    }
    if (uVar14 != extraout_RDX_00) {
      uVar17 = *(uint64_t *)(*(long *)(uVar14 + 0x30) + 0x10);
      if (uVar17 == uVar14) {
        return 2;
      }
      if (*(uint64_t *)(pcVar1 + 0x10) == extraout_RDX_00) {
        return 2;
      }
      while (uVar17 != extraout_RDX_00) {
        uVar17 = *(uint64_t *)(*(long *)(uVar17 + 0x30) + 0x10);
        if (uVar17 == uVar14) {
          return 2;
        }
      }
    }
    if (y_00 != uVar10) {
      uVar14 = *(uint64_t *)(*(long *)(y_00 + 0x30) + 0x10);
      if (uVar14 == y_00) {
        return 2;
      }
      if (*(uint64_t *)(*(long *)(uVar10 + 0x30) + 0x10) == uVar10) {
        return 2;
      }
      while (uVar14 != uVar10) {
        uVar14 = *(uint64_t *)(*(long *)(uVar14 + 0x30) + 0x10);
        if (uVar14 == y_00) {
          return 2;
        }
      }
    }
    _Var6 = do_constant_folding_cond_eq(in_R8D);
LAB_00d4a9f5:
    return (ulong)_Var6;
  }
  in_R8D = 0xdc9f70;
  uVar12 = (uint)x;
  uVar11 = (ushort)x;
  bVar9 = (byte)y;
  uVar13 = (uint)y;
  switch(op) {
  case INDEX_op_add_i32:
  case INDEX_op_add_i64:
    y = y + x;
    break;
  case INDEX_op_sub_i32:
  case INDEX_op_sub_i64:
    y = x - y;
    break;
  case INDEX_op_mul_i32:
  case INDEX_op_mul_i64:
    y = y * x;
    break;
  case INDEX_op_div_i32:
    uVar16 = 1;
    if (1 < uVar13) {
      uVar16 = uVar13;
    }
    y = (long)(int)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | x & 0xffffffff) /
                   (long)(int)uVar16);
    break;
  case INDEX_op_divu_i32:
    uVar8 = 1;
    if (1 < uVar13) {
      uVar8 = y & 0xffffffff;
    }
    y = (x & 0xffffffff) / uVar8;
    break;
  case INDEX_op_rem_i32:
    uVar16 = 1;
    if (1 < uVar13) {
      uVar16 = uVar13;
    }
    y = (long)(int)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | x & 0xffffffff) %
                   (long)(int)uVar16);
    break;
  case INDEX_op_remu_i32:
    uVar8 = 1;
    if (1 < uVar13) {
      uVar8 = y & 0xffffffff;
    }
    y = (x & 0xffffffff) % uVar8;
    break;
  default:
    goto switchD_00d4a5bf_caseD_18;
  case INDEX_op_xor_i32:
  case INDEX_op_xor_i64:
    y = y ^ x;
    break;
  case INDEX_op_shl_i32:
    y = (TCGArg)(uVar12 << (bVar9 & 0x1f));
    break;
  case INDEX_op_shr_i32:
    y = (TCGArg)(uVar12 >> (bVar9 & 0x1f));
    break;
  case INDEX_op_sar_i32:
    x = (TCGArg)(uint)((int)uVar12 >> (bVar9 & 0x1f));
  case INDEX_op_ext_i32_i64:
  case INDEX_op_ext32s_i64:
    y = (long)(int)x;
    break;
  case INDEX_op_rotl_i32:
    y = (TCGArg)(uVar12 << (bVar9 & 0x1f) | uVar12 >> 0x20 - (bVar9 & 0x1f));
    break;
  case INDEX_op_rotr_i32:
    y = (TCGArg)(uVar12 >> (bVar9 & 0x1f) | uVar12 << 0x20 - (bVar9 & 0x1f));
    break;
  case INDEX_op_muluh_i32:
    y = (y & 0xffffffff) * (x & 0xffffffff) >> 0x20;
    break;
  case INDEX_op_mulsh_i32:
    y = (long)(int)uVar13 * (long)(int)uVar12 >> 0x20;
    break;
  case INDEX_op_ext8s_i32:
  case INDEX_op_ext8s_i64:
    y = (long)(char)x;
    break;
  case INDEX_op_ext16s_i32:
  case INDEX_op_ext16s_i64:
    y = (long)(short)uVar11;
    break;
  case INDEX_op_ext8u_i32:
  case INDEX_op_ext8u_i64:
    y = x & 0xff;
    break;
  case INDEX_op_bswap16_i32:
  case INDEX_op_bswap16_i64:
    x = (TCGArg)(ushort)(uVar11 << 8 | uVar11 >> 8);
  case INDEX_op_ext16u_i32:
  case INDEX_op_ext16u_i64:
    y = x & 0xffff;
    break;
  case INDEX_op_bswap32_i32:
  case INDEX_op_bswap32_i64:
    y = (TCGArg)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18
                );
    break;
  case INDEX_op_not_i32:
  case INDEX_op_not_i64:
    y = ~x;
    break;
  case INDEX_op_neg_i32:
  case INDEX_op_neg_i64:
    y = -x;
    break;
  case INDEX_op_andc_i32:
  case INDEX_op_andc_i64:
    y = ~y;
  case INDEX_op_and_i32:
  case INDEX_op_and_i64:
    y = y & x;
    break;
  case INDEX_op_orc_i32:
  case INDEX_op_orc_i64:
    y = ~y;
  case INDEX_op_or_i32:
  case INDEX_op_or_i64:
    y = y | x;
    break;
  case INDEX_op_eqv_i32:
  case INDEX_op_eqv_i64:
    uVar8 = y ^ x;
    goto LAB_00d4a649;
  case INDEX_op_nand_i32:
  case INDEX_op_nand_i64:
    uVar8 = y & x;
    goto LAB_00d4a649;
  case INDEX_op_nor_i32:
  case INDEX_op_nor_i64:
    uVar8 = y | x;
LAB_00d4a649:
    y = ~uVar8;
    break;
  case INDEX_op_clz_i32:
    if (uVar12 != 0) {
      uVar13 = 0x1f;
      if (uVar12 != 0) {
        for (; uVar12 >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      y = (ulong)(uVar13 ^ 0x1f);
    }
    break;
  case INDEX_op_ctz_i32:
    if (uVar12 != 0) {
      uVar13 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
        }
      }
      y = (ulong)uVar13;
    }
    break;
  case INDEX_op_ctpop_i32:
    uVar12 = uVar12 - ((uint)(x >> 1) & 0x55555555);
    uVar13 = (uVar12 >> 2 & 0x33333333) + (uVar12 & 0x33333333);
    y = (ulong)(((uVar13 >> 4) + uVar13 & 0xf0f0f0f) * 0x1010101 >> 0x18);
    break;
  case INDEX_op_div_i64:
    y = (long)x / (long)(y + (y == 0));
    break;
  case INDEX_op_divu_i64:
    y = x / (y + (y == 0));
    break;
  case INDEX_op_rem_i64:
    y = (long)x % (long)(y + (y == 0));
    break;
  case INDEX_op_remu_i64:
    y = x % (y + (y == 0));
    break;
  case INDEX_op_shl_i64:
    y = x << (bVar9 & 0x3f);
    break;
  case INDEX_op_shr_i64:
    y = x >> (bVar9 & 0x3f);
    break;
  case INDEX_op_sar_i64:
    y = (long)x >> (bVar9 & 0x3f);
    break;
  case INDEX_op_rotl_i64:
    y = x << (bVar9 & 0x3f) | x >> 0x40 - (bVar9 & 0x3f);
    break;
  case INDEX_op_rotr_i64:
    y = x >> (bVar9 & 0x3f) | x << 0x40 - (bVar9 & 0x3f);
    break;
  case INDEX_op_extu_i32_i64:
  case INDEX_op_extrl_i64_i32:
  case INDEX_op_ext32u_i64:
    y = x & 0xffffffff;
    break;
  case INDEX_op_extrh_i64_i32:
    y = x >> 0x20;
    break;
  case INDEX_op_bswap64_i64:
    y = x >> 0x38 | (x & 0xff000000000000) >> 0x28 | (x & 0xff0000000000) >> 0x18 |
        (x & 0xff00000000) >> 8 | (x & 0xff000000) << 8 | (x & 0xff0000) << 0x18 |
        (x & 0xff00) << 0x28 | x << 0x38;
    break;
  case INDEX_op_clz_i64:
    uVar8 = 0x3f;
    if (x != 0) {
      for (; x >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = uVar8 ^ 0x3f;
    goto LAB_00d4a7c3;
  case INDEX_op_ctz_i64:
    uVar8 = 0;
    if (x != 0) {
      for (; (x >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
      }
    }
LAB_00d4a7c3:
    if (x != 0) {
      y = uVar8;
    }
    break;
  case INDEX_op_ctpop_i64:
    uVar8 = x - (x >> 1 & 0x5555555555555555);
    uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
    y = ((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
    break;
  case INDEX_op_muluh_i64:
    auVar3._8_8_ = 0;
    auVar3._0_8_ = y;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = x;
    y = SUB168(auVar3 * auVar4,8);
    break;
  case INDEX_op_mulsh_i64:
    y = SUB168(SEXT816((long)y) * SEXT816((long)x),8);
  }
  TVar7 = (long)(int)y;
  if ((*(byte *)((long)&s->pool_end + (ulong)op * 0x20 + 4) & 0x10) != 0) {
    TVar7 = y;
  }
  return TVar7;
}

Assistant:

static TCGArg do_constant_folding_2(TCGOpcode op, TCGArg x, TCGArg y)
{
    uint64_t l64, h64;

    switch (op) {
    CASE_OP_32_64(add):
        return x + y;

    CASE_OP_32_64(sub):
        return x - y;

    CASE_OP_32_64(mul):
        return x * y;

    CASE_OP_32_64(and):
        return x & y;

    CASE_OP_32_64(or):
        return x | y;

    CASE_OP_32_64(xor):
        return x ^ y;

    case INDEX_op_shl_i32:
        return (uint32_t)x << (y & 31);

    case INDEX_op_shl_i64:
        return (uint64_t)x << (y & 63);

    case INDEX_op_shr_i32:
        return (uint32_t)x >> (y & 31);

    case INDEX_op_shr_i64:
        return (uint64_t)x >> (y & 63);

    case INDEX_op_sar_i32:
        return (int32_t)x >> (y & 31);

    case INDEX_op_sar_i64:
        return (int64_t)x >> (y & 63);

    case INDEX_op_rotr_i32:
        return ror32(x, y & 31);

    case INDEX_op_rotr_i64:
        return ror64(x, y & 63);

    case INDEX_op_rotl_i32:
        return rol32(x, y & 31);

    case INDEX_op_rotl_i64:
        return rol64(x, y & 63);

    CASE_OP_32_64(not):
        return ~x;

    CASE_OP_32_64(neg):
#ifdef _MSC_VER
        return (0 - x);
#else
        return -x;
#endif

    CASE_OP_32_64(andc):
        return x & ~y;

    CASE_OP_32_64(orc):
        return x | ~y;

    CASE_OP_32_64(eqv):
        return ~(x ^ y);

    CASE_OP_32_64(nand):
        return ~(x & y);

    CASE_OP_32_64(nor):
        return ~(x | y);

    case INDEX_op_clz_i32:
        return (uint32_t)x ? clz32(x) : y;

    case INDEX_op_clz_i64:
        return x ? clz64(x) : y;

    case INDEX_op_ctz_i32:
        return (uint32_t)x ? ctz32(x) : y;

    case INDEX_op_ctz_i64:
        return x ? ctz64(x) : y;

    case INDEX_op_ctpop_i32:
        return ctpop32(x);

    case INDEX_op_ctpop_i64:
        return ctpop64(x);

    CASE_OP_32_64(ext8s):
        return (int8_t)x;

    CASE_OP_32_64(ext16s):
        return (int16_t)x;

    CASE_OP_32_64(ext8u):
        return (uint8_t)x;

    CASE_OP_32_64(ext16u):
        return (uint16_t)x;

    CASE_OP_32_64(bswap16):
        return bswap16(x);

    CASE_OP_32_64(bswap32):
        return bswap32(x);

    case INDEX_op_bswap64_i64:
        return bswap64(x);

    case INDEX_op_ext_i32_i64:
    case INDEX_op_ext32s_i64:
        return (int32_t)x;

    case INDEX_op_extu_i32_i64:
    case INDEX_op_extrl_i64_i32:
    case INDEX_op_ext32u_i64:
        return (uint32_t)x;

    case INDEX_op_extrh_i64_i32:
        return (uint64_t)x >> 32;

    case INDEX_op_muluh_i32:
        return ((uint64_t)(uint32_t)x * (uint32_t)y) >> 32;
    case INDEX_op_mulsh_i32:
        return ((int64_t)(int32_t)x * (int32_t)y) >> 32;

    case INDEX_op_muluh_i64:
        mulu64(&l64, &h64, x, y);
        return h64;
    case INDEX_op_mulsh_i64:
        muls64(&l64, &h64, x, y);
        return h64;

    case INDEX_op_div_i32:
        /* Avoid crashing on divide by zero, otherwise undefined.  */
        return (int32_t)x / ((int32_t)y ? (int32_t)y : 1);
    case INDEX_op_divu_i32:
        return (uint32_t)x / ((uint32_t)y ? (uint32_t)y : 1);
    case INDEX_op_div_i64:
        return (int64_t)x / ((int64_t)y ? (int64_t)y : 1);
    case INDEX_op_divu_i64:
        return (uint64_t)x / ((uint64_t)y ? (uint64_t)y : 1);

    case INDEX_op_rem_i32:
        return (int32_t)x % ((int32_t)y ? (int32_t)y : 1);
    case INDEX_op_remu_i32:
        return (uint32_t)x % ((uint32_t)y ? (uint32_t)y : 1);
    case INDEX_op_rem_i64:
        return (int64_t)x % ((int64_t)y ? (int64_t)y : 1);
    case INDEX_op_remu_i64:
        return (uint64_t)x % ((uint64_t)y ? (uint64_t)y : 1);

    default:
        fprintf(stderr,
                "Unrecognized operation %d in do_constant_folding.\n", op);
        tcg_abort();
    }
}